

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O3

int netaddr_create_prefix(netaddr *prefix,netaddr *host,netaddr *netmask,_Bool truncate)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  bVar1 = host->_type;
  if ((bVar1 == 0) || (bVar1 != netmask->_type)) {
    return -1;
  }
  bVar2 = true;
  if (bVar1 < 0x2f) {
    if (bVar1 == 2) {
      uVar4 = 4;
      goto LAB_001418fb;
    }
    if (bVar1 == 10) {
      uVar4 = 0x10;
      goto LAB_001418fb;
    }
  }
  else {
    if (bVar1 == 0x2f) {
      uVar4 = 6;
      goto LAB_001418fb;
    }
    if (bVar1 == 0x30) {
      uVar4 = 8;
      goto LAB_001418fb;
    }
  }
  bVar2 = false;
  uVar4 = 0;
LAB_001418fb:
  prefix->_prefix_len = '\0';
  prefix->_type = host->_type;
  if (!truncate) {
    uVar3 = *(undefined8 *)(host->_addr + 8);
    *(undefined8 *)prefix->_addr = *(undefined8 *)host->_addr;
    *(undefined8 *)(prefix->_addr + 8) = uVar3;
  }
  if (bVar2) {
    uVar6 = 0;
    do {
      if (truncate) {
        prefix->_addr[uVar6] = netmask->_addr[uVar6] & host->_addr[uVar6];
      }
      bVar1 = netmask->_addr[uVar6];
      if (bVar1 != 0xff) {
        uVar5 = (uint)bVar1;
        if (bVar1 < 0xf0) {
          if (0xbf < uVar5) {
            if (bVar1 == 0xc0) {
              prefix->_prefix_len = prefix->_prefix_len + '\x02';
              return 0;
            }
            if (bVar1 == 0xe0) {
              prefix->_prefix_len = prefix->_prefix_len + '\x03';
              return 0;
            }
            return -1;
          }
          if (bVar1 == 0) {
            return uVar5;
          }
          if (uVar5 == 0x80) {
            prefix->_prefix_len = prefix->_prefix_len + '\x01';
            return 0;
          }
          return -1;
        }
        if (bVar1 < 0xfc) {
          if (bVar1 == 0xf0) {
            prefix->_prefix_len = prefix->_prefix_len + '\x04';
            return 0;
          }
          if (uVar5 == 0xf8) {
            prefix->_prefix_len = prefix->_prefix_len + '\x05';
            return 0;
          }
          return -1;
        }
        if (bVar1 == 0xfc) {
          prefix->_prefix_len = prefix->_prefix_len + '\x06';
          return 0;
        }
        if (bVar1 == 0xfe) {
          prefix->_prefix_len = prefix->_prefix_len + '\a';
          return 0;
        }
        return -1;
      }
      prefix->_prefix_len = prefix->_prefix_len + '\b';
      uVar6 = uVar6 + 2;
    } while (uVar6 < uVar4);
  }
  return 0;
}

Assistant:

int
netaddr_create_prefix(
  struct netaddr *prefix, const struct netaddr *host, const struct netaddr *netmask, bool truncate) {
  int len, maxlen;
  if (host->_type != netmask->_type || host->_type == AF_UNSPEC) {
    return -1;
  }

  /* get address length */
  maxlen = netaddr_get_af_maxprefix(host->_type) / 8;

  /* initialize prefix */
  prefix->_prefix_len = 0;
  prefix->_type = host->_type;

  if (!truncate) {
    memcpy(&prefix->_addr[0], &host->_addr[0], 16);
  }

  for (len = 0; len < maxlen; len++) {
    if (truncate) {
      prefix->_addr[len] = host->_addr[len] & netmask->_addr[len];
    }

    switch (netmask->_addr[len]) {
      case 255:
        len++;
        prefix->_prefix_len += 8;
        break;
      case 254:
        prefix->_prefix_len += 7;
        return 0;
      case 252:
        prefix->_prefix_len += 6;
        return 0;
      case 248:
        prefix->_prefix_len += 5;
        return 0;
      case 240:
        prefix->_prefix_len += 4;
        return 0;
      case 224:
        prefix->_prefix_len += 3;
        return 0;
      case 192:
        prefix->_prefix_len += 2;
        return 0;
      case 128:
        prefix->_prefix_len += 1;
        return 0;
      case 0:
        return 0;
      default:
        return -1;
    }
  }
  return 0;
}